

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O2

bool __thiscall cmVSLink::Parse(cmVSLink *this,const_iterator argBeg,const_iterator argEnd)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *__rhs;
  cmVSLink *pcVar1;
  cmVSLink *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  allocator local_81;
  cmVSLink *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string intDir;
  
  intDir._M_dataplus._M_p = (pointer)&intDir.field_2;
  intDir._M_string_length = 0;
  intDir.field_2._M_local_buf[0] = '\0';
  local_80 = this;
  while( true ) {
    if ((argBeg._M_current == argEnd._M_current) ||
       (bVar3 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                          (argBeg._M_current,(char (*) [2])0x48fcb0), !bVar3)) goto LAB_00269356;
    bVar3 = std::operator==(argBeg._M_current,"--");
    if (bVar3) break;
    bVar3 = std::operator==(argBeg._M_current,"--manifests");
    if (bVar3) {
      while ((argBeg._M_current = argBeg._M_current + 1, argBeg._M_current != argEnd._M_current &&
             (bVar3 = cmHasLiteralPrefix<std::__cxx11::string,2ul>
                                (argBeg._M_current,(char (*) [2])0x48fcb0), !bVar3))) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->UserManifests,argBeg._M_current);
      }
    }
    else {
      bVar3 = cmHasLiteralPrefix<std::__cxx11::string,10ul>
                        (argBeg._M_current,(char (*) [10])"--intdir=");
      if (!bVar3) {
        poVar5 = std::operator<<((ostream *)&std::cerr,"unknown argument \'");
        poVar5 = std::operator<<(poVar5,(string *)argBeg._M_current);
        std::operator<<(poVar5,"\'\n");
        goto LAB_00269578;
      }
      std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
      std::__cxx11::string::operator=((string *)&intDir,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      argBeg._M_current = argBeg._M_current + 1;
    }
  }
  argBeg._M_current = argBeg._M_current + 1;
LAB_00269356:
  pcVar1 = local_80;
  bVar3 = false;
  if ((intDir._M_string_length != 0) && (argBeg._M_current != argEnd._M_current)) {
    this_00 = &local_80->LinkCommand;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
               (local_80->LinkCommand).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )argBeg._M_current,
               (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )argEnd._M_current);
    for (; pcVar2 = local_80, argBeg._M_current != argEnd._M_current;
        argBeg._M_current = argBeg._M_current + 1) {
      iVar4 = cmsys::SystemTools::Strucmp
                        (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL:YES");
      if ((iVar4 == 0) ||
         (iVar4 = cmsys::SystemTools::Strucmp
                            (((argBeg._M_current)->_M_dataplus)._M_p,"/INCREMENTAL"), iVar4 == 0)) {
        local_80->Incremental = true;
      }
      else {
        iVar4 = cmsys::SystemTools::Strucmp(((argBeg._M_current)->_M_dataplus)._M_p,"/MANIFEST:NO");
        if (iVar4 == 0) {
          local_80->LinkGeneratesManifest = false;
        }
        else {
          bVar3 = cmHasLiteralPrefix<std::__cxx11::string,4ul>
                            (argBeg._M_current,(char (*) [4])"/Fe");
          if (bVar3) {
            std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
          }
          else {
            bVar3 = cmHasLiteralPrefix<std::__cxx11::string,6ul>
                              (argBeg._M_current,(char (*) [6])"/out:");
            if (!bVar3) goto LAB_00269454;
            std::__cxx11::string::substr((ulong)&local_78,(ulong)argBeg._M_current);
          }
          std::__cxx11::string::operator=((string *)&pcVar1->TargetFile,(string *)&local_78);
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
LAB_00269454:
    }
    if ((local_80->TargetFile)._M_string_length == 0) {
LAB_00269578:
      bVar3 = false;
    }
    else {
      std::operator+(&local_78,&intDir,"/embed.manifest");
      std::__cxx11::string::operator=((string *)&pcVar2->ManifestFile,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::operator+(&local_78,&intDir,"/intermediate.manifest");
      __rhs = &pcVar2->LinkerManifestFile;
      std::__cxx11::string::operator=((string *)__rhs,(string *)&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      if (pcVar2->Incremental == true) {
        std::operator+(&local_78,&intDir,"/manifest.rc");
        std::__cxx11::string::operator=((string *)&pcVar2->ManifestFileRC,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::operator+(&local_78,&intDir,"/manifest.res");
        std::__cxx11::string::operator=((string *)&pcVar2->ManifestFileRes,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else if ((pcVar2->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start ==
               (pcVar2->UserManifests).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_78,&pcVar1->TargetFile,".manifest");
        std::__cxx11::string::operator=((string *)&pcVar2->ManifestFile,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::_M_assign((string *)__rhs);
      }
      bVar3 = true;
      if (pcVar2->LinkGeneratesManifest == true) {
        std::__cxx11::string::string((string *)&local_78,"/MANIFEST",&local_81);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::operator+(&local_78,"/MANIFESTFILE:",__rhs);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,
                   &local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
    }
  }
  std::__cxx11::string::~string((string *)&intDir);
  return bVar3;
}

Assistant:

bool cmVSLink::Parse(std::vector<std::string>::const_iterator argBeg,
                     std::vector<std::string>::const_iterator argEnd)
{
  // Parse our own arguments.
  std::string intDir;
  std::vector<std::string>::const_iterator arg = argBeg;
  while (arg != argEnd && cmHasLiteralPrefix(*arg, "-"))
    {
    if (*arg == "--")
      {
      ++arg;
      break;
      }
    else if (*arg == "--manifests")
      {
      for (++arg; arg != argEnd && !cmHasLiteralPrefix(*arg, "-"); ++arg)
        {
        this->UserManifests.push_back(*arg);
        }
      }
    else if (cmHasLiteralPrefix(*arg, "--intdir="))
      {
      intDir = arg->substr(9);
      ++arg;
      }
    else
      {
      std::cerr << "unknown argument '" << *arg << "'\n";
      return false;
      }
    }
  if (intDir.empty())
    {
    return false;
    }

  // The rest of the arguments form the link command.
  if (arg == argEnd)
    {
    return false;
    }
  this->LinkCommand.insert(this->LinkCommand.begin(), arg, argEnd);

  // Parse the link command to extract information we need.
  for (; arg != argEnd; ++arg)
    {
    if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL:YES") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/INCREMENTAL") == 0)
      {
      this->Incremental = true;
      }
    else if (cmSystemTools::Strucmp(arg->c_str(), "/MANIFEST:NO") == 0)
      {
      this->LinkGeneratesManifest = false;
      }
    else if (cmHasLiteralPrefix(*arg, "/Fe"))
      {
      this->TargetFile = arg->substr(3);
      }
    else if (cmHasLiteralPrefix(*arg, "/out:"))
      {
      this->TargetFile = arg->substr(5);
      }
    }

  if (this->TargetFile.empty())
    {
    return false;
    }

  this->ManifestFile = intDir + "/embed.manifest";
  this->LinkerManifestFile = intDir + "/intermediate.manifest";

  if (this->Incremental)
    {
    // We will compile a resource containing the manifest and
    // pass it to the link command.
    this->ManifestFileRC = intDir + "/manifest.rc";
    this->ManifestFileRes = intDir + "/manifest.res";
    }
  else if (this->UserManifests.empty())
    {
    // Prior to support for user-specified manifests CMake placed the
    // linker-generated manifest next to the binary (as if it were not to be
    // embedded) when not linking incrementally.  Preserve this behavior.
    this->ManifestFile = this->TargetFile + ".manifest";
    this->LinkerManifestFile = this->ManifestFile;
    }

  if (this->LinkGeneratesManifest)
    {
    this->LinkCommand.push_back("/MANIFEST");
    this->LinkCommand.push_back("/MANIFESTFILE:" + this->LinkerManifestFile);
    }

  return true;
}